

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::
FixContainingTypeInDescriptor<google::protobuf::EnumDescriptor>
          (Generator *this,EnumDescriptor *descriptor,Descriptor *containing_descriptor)

{
  string parent_name;
  string nested_name;
  string local_50;
  string local_30;
  
  if (containing_descriptor != (Descriptor *)0x0) {
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(&local_30,this,descriptor);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_50,this,containing_descriptor);
    io::Printer::Print(this->printer_,"$nested_name$.containing_type = $parent_name$\n",
                       "nested_name",&local_30,"parent_name",&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Generator::FixContainingTypeInDescriptor(
    const DescriptorT& descriptor,
    const Descriptor* containing_descriptor) const {
  if (containing_descriptor != NULL) {
    const string nested_name = ModuleLevelDescriptorName(descriptor);
    const string parent_name = ModuleLevelDescriptorName(
        *containing_descriptor);
    printer_->Print(
        "$nested_name$.containing_type = $parent_name$\n",
        "nested_name", nested_name,
        "parent_name", parent_name);
  }
}